

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::HandleDeleteCacheVariables(cmake *this,string *var)

{
  cmState *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  pointer pbVar6;
  pointer key;
  allocator local_269;
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> saved;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argsSplit;
  SaveCacheEntry save;
  string local_1c8;
  ostringstream warning;
  
  argsSplit.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  argsSplit.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  argsSplit.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&warning,(string *)var);
  cmSystemTools::ExpandListArgument((string *)&warning,&argsSplit,true);
  std::__cxx11::string::~string((string *)&warning);
  pcVar1 = this->State;
  std::__cxx11::string::string
            ((string *)&warning,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",(allocator *)&save);
  cmState::SetGlobalProperty(pcVar1,(string *)&warning,"");
  std::__cxx11::string::~string((string *)&warning);
  bVar2 = cmState::GetIsInTryCompile(this->State);
  iVar3 = 0;
  if (!bVar2) {
    saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&warning);
    poVar4 = std::operator<<((ostream *)&warning,
                             "You have changed variables that require your cache to be deleted.\n");
    poVar4 = std::operator<<(poVar4,
                             "Configure will be re-run and you may have to reset some variables.\n")
    ;
    std::operator<<(poVar4,"The following variables have changed:\n");
    for (pbVar6 = argsSplit.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 != argsSplit.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 2) {
      save.key._M_dataplus._M_p = (pointer)&save.key.field_2;
      save.key._M_string_length = 0;
      save.key.field_2._M_local_buf[0] = '\0';
      save.value._M_dataplus._M_p = (pointer)&save.value.field_2;
      save.value._M_string_length = 0;
      save.value.field_2._M_local_buf[0] = '\0';
      save.help._M_dataplus._M_p = (pointer)&save.help.field_2;
      save.help._M_string_length = 0;
      save.help.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_assign((string *)&save);
      poVar4 = std::operator<<((ostream *)&warning,(string *)pbVar6);
      std::operator<<(poVar4,"= ");
      std::__cxx11::string::_M_assign((string *)&save.value);
      poVar4 = std::operator<<((ostream *)&warning,(string *)(pbVar6 + 1));
      std::operator<<(poVar4,"\n");
      pcVar5 = cmState::GetCacheEntryValue(this->State,&save.key);
      if (pcVar5 != (char *)0x0) {
        save.type = cmState::GetCacheEntryType(this->State,&save.key);
        pcVar1 = this->State;
        std::__cxx11::string::string((string *)&local_1c8,"HELPSTRING",&local_269);
        pcVar5 = cmState::GetCacheEntryProperty(pcVar1,&save.key,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        if (pcVar5 != (char *)0x0) {
          std::__cxx11::string::assign((char *)&save.help);
        }
      }
      std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::push_back(&saved,&save);
      SaveCacheEntry::~SaveCacheEntry(&save);
    }
    pcVar5 = GetHomeOutputDirectory(this);
    std::__cxx11::string::string((string *)&save,pcVar5,(allocator *)&local_1c8);
    DeleteCache(this,&save.key);
    std::__cxx11::string::~string((string *)&save);
    LoadCache(this);
    for (key = saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
               super__Vector_impl_data._M_start;
        key != saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
               super__Vector_impl_data._M_finish; key = key + 1) {
      AddCacheEntry(this,&key->key,(key->value)._M_dataplus._M_p,(key->help)._M_dataplus._M_p,
                    key->type);
    }
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message(save.key._M_dataplus._M_p,(char *)0x0);
    std::__cxx11::string::~string((string *)&save);
    bVar2 = cmSystemTools::GetErrorOccuredFlag();
    iVar3 = 0;
    if (!bVar2) {
      iVar3 = Configure(this);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&warning);
    std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::~vector(&saved);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&argsSplit);
  return iVar3;
}

Assistant:

int cmake::HandleDeleteCacheVariables(const std::string& var)
{
  std::vector<std::string> argsSplit;
  cmSystemTools::ExpandListArgument(std::string(var), argsSplit, true);
  // erase the property to avoid infinite recursion
  this->State->SetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_", "");
  if (this->State->GetIsInTryCompile()) {
    return 0;
  }
  std::vector<SaveCacheEntry> saved;
  std::ostringstream warning;
  /* clang-format off */
  warning
    << "You have changed variables that require your cache to be deleted.\n"
    << "Configure will be re-run and you may have to reset some variables.\n"
    << "The following variables have changed:\n";
  /* clang-format on */
  for (std::vector<std::string>::iterator i = argsSplit.begin();
       i != argsSplit.end(); ++i) {
    SaveCacheEntry save;
    save.key = *i;
    warning << *i << "= ";
    i++;
    save.value = *i;
    warning << *i << "\n";
    const char* existingValue = this->State->GetCacheEntryValue(save.key);
    if (existingValue) {
      save.type = this->State->GetCacheEntryType(save.key);
      if (const char* help =
            this->State->GetCacheEntryProperty(save.key, "HELPSTRING")) {
        save.help = help;
      }
    }
    saved.push_back(save);
  }

  // remove the cache
  this->DeleteCache(this->GetHomeOutputDirectory());
  // load the empty cache
  this->LoadCache();
  // restore the changed compilers
  for (std::vector<SaveCacheEntry>::iterator i = saved.begin();
       i != saved.end(); ++i) {
    this->AddCacheEntry(i->key, i->value.c_str(), i->help.c_str(), i->type);
  }
  cmSystemTools::Message(warning.str().c_str());
  // avoid reconfigure if there were errors
  if (!cmSystemTools::GetErrorOccuredFlag()) {
    // re-run configure
    return this->Configure();
  }
  return 0;
}